

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O0

int Fraig_TableRehashF0(Fraig_Man_t *pMan,int fLinkEquiv)

{
  Fraig_HashTable_t *pFVar1;
  Fraig_Node_t **__s;
  uint uVar2;
  Fraig_Node_t *local_80;
  Fraig_Node_t *local_78;
  Fraig_Node_t *local_70;
  Fraig_Node_t *local_68;
  int local_5c;
  uint Key;
  int i;
  int Counter;
  int ReturnValue;
  Fraig_Node_t *pEntN;
  Fraig_Node_t *pEntD2;
  Fraig_Node_t *pEnt;
  Fraig_Node_t *pEntF2;
  Fraig_Node_t *pEntF;
  Fraig_Node_t **pBinsNew;
  Fraig_HashTable_t *pT;
  int fLinkEquiv_local;
  Fraig_Man_t *pMan_local;
  
  pFVar1 = pMan->pTableF0;
  __s = (Fraig_Node_t **)malloc((long)pFVar1->nBins << 3);
  memset(__s,0,(long)pFVar1->nBins << 3);
  Key = 0;
  i = 0;
  local_5c = 0;
  do {
    if (pFVar1->nBins <= local_5c) {
      if (Key != pFVar1->nEntries) {
        __assert_fail("Counter == pT->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigTable.c"
                      ,0x28b,"int Fraig_TableRehashF0(Fraig_Man_t *, int)");
      }
      if (pFVar1->pBins != (Fraig_Node_t **)0x0) {
        free(pFVar1->pBins);
        pFVar1->pBins = (Fraig_Node_t **)0x0;
      }
      pFVar1->pBins = __s;
      return i;
    }
    pEntF2 = pFVar1->pBins[local_5c];
    if (pEntF2 == (Fraig_Node_t *)0x0) {
      local_68 = (Fraig_Node_t *)0x0;
    }
    else {
      local_68 = pEntF2->pNextF;
    }
    pEnt = local_68;
    while (pEntF2 != (Fraig_Node_t *)0x0) {
      pEntD2 = pEntF2;
      if (pEntF2 == (Fraig_Node_t *)0x0) {
        local_70 = (Fraig_Node_t *)0x0;
      }
      else {
        local_70 = pEntF2->pNextD;
      }
      pEntN = local_70;
      while (pEntD2 != (Fraig_Node_t *)0x0) {
        uVar2 = pEntD2->uHashD % (uint)pFVar1->nBins;
        if (fLinkEquiv == 0) {
LAB_00782be2:
          pEntD2->pNextF = __s[uVar2];
          __s[uVar2] = pEntD2;
          pEntD2->pNextD = (Fraig_Node_t *)0x0;
          Key = Key + 1;
        }
        else {
          for (_Counter = __s[uVar2]; _Counter != (Fraig_Node_t *)0x0; _Counter = _Counter->pNextF)
          {
            if (pEntD2->uHashD == _Counter->uHashD) {
              pEntD2->pNextD = _Counter->pNextD;
              _Counter->pNextD = pEntD2;
              i = 1;
              Key = Key + 1;
              break;
            }
          }
          if (_Counter == (Fraig_Node_t *)0x0) goto LAB_00782be2;
        }
        pEntD2 = pEntN;
        if (pEntN == (Fraig_Node_t *)0x0) {
          local_78 = (Fraig_Node_t *)0x0;
        }
        else {
          local_78 = pEntN->pNextD;
        }
        pEntN = local_78;
      }
      pEntF2 = pEnt;
      if (pEnt == (Fraig_Node_t *)0x0) {
        local_80 = (Fraig_Node_t *)0x0;
      }
      else {
        local_80 = pEnt->pNextF;
      }
      pEnt = local_80;
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

int Fraig_TableRehashF0( Fraig_Man_t * pMan, int fLinkEquiv )
{
    Fraig_HashTable_t * pT = pMan->pTableF0;
    Fraig_Node_t ** pBinsNew;
    Fraig_Node_t * pEntF, * pEntF2, * pEnt, * pEntD2, * pEntN;
    int ReturnValue, Counter, i;
    unsigned Key;

    // allocate a new array of bins
    pBinsNew = ABC_ALLOC( Fraig_Node_t *, pT->nBins );
    memset( pBinsNew, 0, sizeof(Fraig_Node_t *) * pT->nBins );

    // rehash the entries in the table
    // go through all the nodes in the F-lists (and possible in D-lists, if used)
    Counter = 0;
    ReturnValue = 0;
    for ( i = 0; i < pT->nBins; i++ )
        Fraig_TableBinForEachEntrySafeF( pT->pBins[i], pEntF, pEntF2 )
        Fraig_TableBinForEachEntrySafeD( pEntF, pEnt, pEntD2 )
        {
            // decide where to put entry pEnt
            Key = pEnt->uHashD % pT->nBins;
            if ( fLinkEquiv )
            {
                // go through the entries in the new bin
                Fraig_TableBinForEachEntryF( pBinsNew[Key], pEntN )
                {
                    // if they have different values skip
                    if ( pEnt->uHashD != pEntN->uHashD )
                        continue;
                    // they have the same hash value, add pEnt to the D-list pEnt3
                    pEnt->pNextD  = pEntN->pNextD;
                    pEntN->pNextD = pEnt;
                    ReturnValue = 1;
                    Counter++;
                    break;
                }
                if ( pEntN != NULL ) // already linked
                    continue;
                // we did not find equal entry
            }
            // link the new entry
            pEnt->pNextF  = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            pEnt->pNextD  = NULL;
            Counter++;
        }
    assert( Counter == pT->nEntries );
    // replace the table and the parameters
    ABC_FREE( pT->pBins );
    pT->pBins = pBinsNew;
    return ReturnValue;
}